

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O0

LinkedSection * next_secdef(GlobalVars *gv)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  MemoryDescr *pMVar5;
  lword s_lma;
  lword s_addr;
  int ret;
  LinkedSection *ls;
  char s_type [256];
  Phdr *p;
  char *keyword;
  lword in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  uint32_t in_stack_fffffffffffffecc;
  LinkedSection *in_stack_fffffffffffffed0;
  GlobalVars *in_stack_fffffffffffffed8;
  uint8_t in_stack_fffffffffffffeec;
  uint8_t in_stack_fffffffffffffeed;
  uint8_t in_stack_fffffffffffffeee;
  uint8_t in_stack_fffffffffffffeef;
  char *in_stack_fffffffffffffef0;
  GlobalVars *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  lword *in_stack_ffffffffffffff08;
  uint8_t in_stack_ffffffffffffff17;
  char *in_stack_ffffffffffffff18;
  GlobalVars *in_stack_ffffffffffffff20;
  
  level = 1;
  current_ls = (LinkedSection *)0x0;
  while( true ) {
    while( true ) {
      while( true ) {
        do {
          while (pcVar4 = getword(), pcVar4 == (char *)0x0) {
            cVar1 = getchr();
            if (cVar1 != ';') {
              back(1);
              return (LinkedSection *)0x0;
            }
          }
          iVar2 = check_command(in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                                in_stack_fffffffffffffecc);
        } while (iVar2 != 0);
        cVar1 = getchr();
        if (cVar1 != '=') break;
        symbol_assignment(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                          in_stack_ffffffffffffff17);
      }
      back(1);
      in_stack_fffffffffffffed0 =
           find_lnksec(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffeef
                       ,in_stack_fffffffffffffeee,in_stack_fffffffffffffeed,
                       in_stack_fffffffffffffeec);
      if (in_stack_fffffffffffffed0 != (LinkedSection *)0x0) break;
      ierror("next_secdef(): No Section for %s defined",pcVar4);
    }
    current_ls = in_stack_fffffffffffffed0;
    uVar3 = startofsecdef(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                          (lword *)in_stack_fffffffffffffef8);
    if (uVar3 != 0) break;
    in_stack_fffffffffffffecc = 0;
  }
  if ((uVar3 & 2) != 0) {
    change_address((MemoryDescr *)in_stack_fffffffffffffed0,
                   CONCAT44(uVar3,in_stack_fffffffffffffec8));
  }
  if ((uVar3 & 4) != 0) {
    if (in_stack_fffffffffffffed0->destmem == in_stack_fffffffffffffed0->relocmem) {
      pMVar5 = add_memblock((char *)in_stack_fffffffffffffed0,
                            CONCAT44(uVar3,in_stack_fffffffffffffec8),in_stack_fffffffffffffec0);
      in_stack_fffffffffffffed0->destmem = pMVar5;
    }
    change_address((MemoryDescr *)in_stack_fffffffffffffed0,
                   CONCAT44(uVar3,in_stack_fffffffffffffec8));
  }
  secdefbase = (char *)0x0;
  return in_stack_fffffffffffffed0;
}

Assistant:

struct LinkedSection *next_secdef(struct GlobalVars *gv)
/* Find next section definition in script and return the machting
   structure. */
{
  char *keyword;
  struct Phdr *p;

  level = 1;
  current_ls = NULL;

  do {
    while (keyword = getword()) {
      if (check_command(gv,keyword,SCMDF_GLOBAL)) {
        continue;
      }
      else if (getchr() == '=') {
        symbol_assignment(gv,keyword,0);
      }

      else {
        /* check for section definition */
        char s_type[MAXLEN];
        struct LinkedSection *ls;
        int ret;
        lword s_addr,s_lma;

        back(1);
        if (ls = find_lnksec(gv,keyword,0,0,0,0)) {
          current_ls = ls;
          if (ret = startofsecdef(&s_addr,s_type,&s_lma)) {
            if (ret & 2)
              change_address(ls->relocmem,s_addr);
            if (ret & 4) {
              if (ls->destmem == ls->relocmem)
                ls->destmem = add_memblock("lma",MEM_DEFORG,MEM_DEFLEN);
              change_address(ls->destmem,s_lma);
            }

            secdefbase = NULL;
            return ls;
          }
        }
        else
          ierror("next_secdef(): No Section for %s defined",keyword);
      }
    }
  }
  while (getchr() == ';');
  back(1);

#if 0 /* @@@ don't do it - it modifies header size !!! */
  /* scan for empty segments and declare them as unused */
  for (p=gv->phdrlist; p; p=p->next) {
    if (p->type!=PT_PHDR && (p->start==ADDR_NONE || p->start_vma==ADDR_NONE)) {
      p->start = p->start_vma = p->file_end = p->mem_end = 0;
      p->flags &= ~PHDR_USED;
    }
  }
#endif
  return NULL;
}